

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Type * union_decl(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  int iVar1;
  int iVar2;
  C_Type *pCVar3;
  C_Member *pCVar4;
  int iVar5;
  
  pCVar3 = struct_union_decl(parser,rest,tok);
  pCVar3->kind = TY_UNION;
  iVar2 = pCVar3->size;
  if (-1 < iVar2) {
    iVar5 = pCVar3->align;
    for (pCVar4 = pCVar3->members; pCVar4 != (C_Member *)0x0; pCVar4 = pCVar4->next) {
      iVar1 = pCVar4->align;
      if (iVar5 < iVar1) {
        pCVar3->align = iVar1;
        iVar5 = iVar1;
      }
      iVar1 = pCVar4->ty->size;
      if (iVar2 < iVar1) {
        pCVar3->size = iVar1;
        iVar2 = iVar1;
      }
    }
    iVar2 = iVar2 + -1 + iVar5;
    pCVar3->size = iVar2 - iVar2 % iVar5;
  }
  return pCVar3;
}

Assistant:

static C_Type *union_decl(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = struct_union_decl(parser, rest, tok);
  ty->kind = TY_UNION;

  if (ty->size < 0)
    return ty;

  // If union, we don't have to assign offsets because they
  // are already initialized to zero. We need to compute the
  // alignment and the size though.
  for (C_Member *mem = ty->members; mem; mem = mem->next) {
    if (ty->align < mem->align)
      ty->align = mem->align;
    if (ty->size < mem->ty->size)
      ty->size = mem->ty->size;
  }
  ty->size = C_align_to(ty->size, ty->align);
  return ty;
}